

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

int classify_arg(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *types,int bit_field_p)

{
  long lVar1;
  long lVar2;
  int iVar3;
  MIR_type_t MVar4;
  int iVar5;
  mir_size_t mVar6;
  node_t_conflict pnVar7;
  int span_qwords;
  int end_qword;
  int start_qword;
  decl_t decl2;
  node_t_conflict container;
  mir_size_t offset;
  decl_t decl;
  node_t_conflict el;
  int local_50;
  int n_el_qwords;
  int i;
  MIR_type_t subtypes [2];
  MIR_type_t mir_type;
  size_t n_qwords;
  size_t size;
  int bit_field_p_local;
  MIR_type_t *types_local;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  mVar6 = type_size(c2m_ctx,type);
  register0x00000000 = mVar6 + 7 >> 3;
  if (((type->mode == TM_STRUCT) || (type->mode == TM_UNION)) || (type->mode == TM_ARR)) {
    if (register0x00000000 < 3) {
      for (local_50 = 0; (ulong)(long)local_50 < register0x00000000; local_50 = local_50 + 1) {
        types[local_50] = 0x14;
      }
      if (type->mode - TM_STRUCT < 2) {
        pnVar7 = DLIST_node_t_el(&(((type->u).tag_type)->u).ops,1);
        for (decl = (decl_t)DLIST_node_t_head(&(pnVar7->u).ops); decl != (decl_t)0x0;
            decl = (decl_t)DLIST_node_t_next((node_t_conflict)decl)) {
          if (*(int *)decl == 0x6c) {
            lVar1 = *(long *)&decl->width;
            container = *(node_t_conflict *)(lVar1 + 0x10);
            if (*(long *)(lVar1 + 0x48) != 0) {
              lVar2 = *(long *)(*(long *)(lVar1 + 0x48) + 8);
              if ((*(int *)(*(long *)(lVar2 + 0x40) + 0x18) != 4) &&
                 (*(int *)(*(long *)(lVar2 + 0x40) + 0x18) != 5)) {
                __assert_fail("decl2->decl_spec.type->mode == TM_STRUCT || decl2->decl_spec.type->mode == TM_UNION"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                              ,0x45,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)")
                ;
              }
              container = (node_t_conflict)((long)container - *(long *)(lVar2 + 0x10));
            }
            iVar3 = (int)((ulong)container >> 3);
            mVar6 = type_size(c2m_ctx,*(type **)(lVar1 + 0x40));
            if (*(int *)(lVar1 + 4) < 0) {
              iVar5 = classify_arg(c2m_ctx,*(type **)(lVar1 + 0x40),(MIR_type_t *)&n_el_qwords,
                                   (uint)(-1 < *(int *)(lVar1 + 4)));
              if (iVar5 == 0) {
                return 0;
              }
              for (local_50 = 0;
                  local_50 < iVar5 && (ulong)(long)(local_50 + iVar3) < stack0xffffffffffffffc0;
                  local_50 = local_50 + 1) {
                MVar4 = get_result_type((&n_el_qwords)[local_50],types[local_50 + iVar3]);
                types[local_50 + iVar3] = MVar4;
                if (iVar5 < ((int)((long)container + (mVar6 - 1) >> 3) - iVar3) + 1) {
                  MVar4 = get_result_type((&n_el_qwords)[local_50],types[local_50 + iVar3 + 1]);
                  types[local_50 + iVar3 + 1] = MVar4;
                }
              }
            }
            else {
              MVar4 = get_result_type(MIR_T_I64,types[iVar3]);
              types[iVar3] = MVar4;
            }
          }
        }
      }
      else {
        if (type->mode != TM_ARR) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x5b,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
        }
        iVar3 = classify_arg(c2m_ctx,((type->u).ptr_type)->arr_type,(MIR_type_t *)&n_el_qwords,0);
        if (iVar3 == 0) {
          return 0;
        }
        for (local_50 = 0; (ulong)(long)local_50 < stack0xffffffffffffffc0; local_50 = local_50 + 1)
        {
          MVar4 = get_result_type(types[local_50],(&n_el_qwords)[local_50 % iVar3]);
          types[local_50] = MVar4;
        }
      }
      if (stack0xffffffffffffffc0 < 3) {
        for (local_50 = 0; (ulong)(long)local_50 < stack0xffffffffffffffc0; local_50 = local_50 + 1)
        {
          if (types[local_50] == MIR_T_UNDEF) {
            return 0;
          }
          if ((types[local_50] == 0x15) && ((local_50 == 0 || (types[local_50 + -1] != MIR_T_LD))))
          {
            return 0;
          }
        }
        c2m_ctx_local._4_4_ = (int)stack0xffffffffffffffc0;
      }
      else {
        c2m_ctx_local._4_4_ = 0;
      }
    }
    else {
      c2m_ctx_local._4_4_ = 0;
    }
  }
  else {
    iVar3 = scalar_type_p(type);
    if (iVar3 == 0) {
      __assert_fail("scalar_type_p (type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x6c,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
    }
    MVar4 = get_mir_type(c2m_ctx,type);
    if (MVar4 - MIR_T_F < 2) {
      *types = MIR_T_D;
      c2m_ctx_local._4_4_ = 1;
    }
    else if (MVar4 == MIR_T_LD) {
      *types = MIR_T_LD;
      types[1] = 0x15;
      c2m_ctx_local._4_4_ = 2;
    }
    else {
      *types = MIR_T_I64;
      c2m_ctx_local._4_4_ = 1;
    }
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int classify_arg (c2m_ctx_t c2m_ctx, struct type *type, MIR_type_t types[MAX_QWORDS],
                         int bit_field_p MIR_UNUSED) {
  size_t size = type_size (c2m_ctx, type), n_qwords = (size + 7) / 8;
  MIR_type_t mir_type;

  if (type->mode == TM_STRUCT || type->mode == TM_UNION || type->mode == TM_ARR) {
    if (n_qwords > MAX_QWORDS) return 0; /* too big aggregate */

#ifndef _WIN32
    MIR_type_t subtypes[MAX_QWORDS];
    int i, n_el_qwords;
    for (i = 0; (size_t) i < n_qwords; i++) types[i] = (MIR_type_t) NO_CLASS;

    switch (type->mode) {
    case TM_ARR: { /* Arrays are handled as small records.  */
      n_el_qwords = classify_arg (c2m_ctx, type->u.arr_type->el_type, subtypes, FALSE);
      if (n_el_qwords == 0) return 0;
      /* make full types: */
      for (i = 0; (size_t) i < n_qwords; i++)
        types[i] = get_result_type (types[i], subtypes[i % n_el_qwords]);
      break;
    }
    case TM_STRUCT:
    case TM_UNION:
      for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
           el = NL_NEXT (el))
        if (el->code == N_MEMBER) {
          decl_t decl = el->attr;
          mir_size_t offset = decl->offset;
          node_t container;
          if ((container = decl->containing_unnamed_anon_struct_union_member) != NULL) {
            decl_t decl2 = container->attr;
            assert (decl2->decl_spec.type->mode == TM_STRUCT
                    || decl2->decl_spec.type->mode == TM_UNION);
            offset -= decl2->offset;
          }
          int start_qword = offset / 8;
          int end_qword = (offset + type_size (c2m_ctx, decl->decl_spec.type) - 1) / 8;
          int span_qwords = end_qword - start_qword + 1;

          if (decl->bit_offset >= 0) {
            types[start_qword] = get_result_type (MIR_T_I64, types[start_qword]);
          } else {
            n_el_qwords
              = classify_arg (c2m_ctx, decl->decl_spec.type, subtypes, decl->bit_offset >= 0);
            if (n_el_qwords == 0) return 0;
            for (i = 0; i < n_el_qwords && (size_t) (i + start_qword) < n_qwords; i++) {
              types[i + start_qword] = get_result_type (subtypes[i], types[i + start_qword]);
              if (span_qwords > n_el_qwords)
                types[i + start_qword + 1]
                  = get_result_type (subtypes[i], types[i + start_qword + 1]);
            }
          }
        }
      break;
    default: assert (FALSE);
    }

    if (n_qwords > 2) return 0; /* as we don't have vector values (see SSEUP_CLASS) */

    for (i = 0; (size_t) i < n_qwords; i++) {
      if (types[i] == MIR_T_UNDEF) return 0; /* pass in memory if a word class is memory.  */
      if ((enum add_arg_class) types[i] == X87UP_CLASS && (i == 0 || types[i - 1] != MIR_T_LD))
        return 0;
    }
    return n_qwords;
#else
    types[0] = MIR_T_I64;
    return 1;
#endif
  }

  assert (scalar_type_p (type));
  switch (mir_type = get_mir_type (c2m_ctx, type)) {
  case MIR_T_F:
  case MIR_T_D: types[0] = MIR_T_D; return 1;
  case MIR_T_LD:
    types[0] = MIR_T_LD;
    types[1] = (MIR_type_t) X87UP_CLASS;
    return 2;
  default: types[0] = MIR_T_I64; return 1;
  }
}